

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode
UA_Client_Subscriptions_removeMonitoredItem
          (UA_Client *client,UA_UInt32 subscriptionId,UA_UInt32 monitoredItemId)

{
  UA_Logger logger;
  char *pcVar1;
  long lVar2;
  UA_DiagnosticInfo **ppUVar3;
  undefined8 *puVar4;
  byte bVar5;
  UA_DeleteMonitoredItemsRequest in_stack_fffffffffffffdf8;
  UA_StatusCode local_164;
  undefined1 local_160 [4];
  UA_StatusCode retval;
  UA_DeleteMonitoredItemsResponse response;
  UA_DeleteMonitoredItemsRequest request;
  UA_Client_MonitoredItem *mon;
  UA_Client_Subscription *sub;
  UA_UInt32 monitoredItemId_local;
  UA_UInt32 subscriptionId_local;
  UA_Client *client_local;
  
  bVar5 = 0;
  for (mon = (UA_Client_MonitoredItem *)(client->subscriptions).lh_first;
      (mon != (UA_Client_MonitoredItem *)0x0 &&
      ((mon->monitoredNodeId).identifier.numeric != subscriptionId)); mon = (mon->listEntry).le_next
      ) {
  }
  if (mon == (UA_Client_MonitoredItem *)0x0) {
    client_local._4_4_ = 0x80280000;
  }
  else {
    for (request.monitoredItemIds = *(UA_UInt32 **)&mon->attributeID;
        (request.monitoredItemIds != (UA_UInt32 *)0x0 &&
        (request.monitoredItemIds[4] != monitoredItemId));
        request.monitoredItemIds = *(UA_UInt32 **)request.monitoredItemIds) {
    }
    if (request.monitoredItemIds == (UA_UInt32 *)0x0) {
      client_local._4_4_ = 0x80420000;
    }
    else {
      UA_DeleteMonitoredItemsRequest_init
                ((UA_DeleteMonitoredItemsRequest *)&response.diagnosticInfos);
      ppUVar3 = &response.diagnosticInfos;
      puVar4 = (undefined8 *)&stack0xfffffffffffffdf8;
      for (lVar2 = 0x11; lVar2 != 0; lVar2 = lVar2 + -1) {
        *puVar4 = *ppUVar3;
        ppUVar3 = ppUVar3 + (ulong)bVar5 * -2 + 1;
        puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
      }
      UA_Client_Service_deleteMonitoredItems
                ((UA_DeleteMonitoredItemsResponse *)local_160,client,in_stack_fffffffffffffdf8);
      local_164 = response.responseHeader.timestamp._4_4_;
      if ((response.responseHeader.timestamp._4_4_ == 0) &&
         ((UA_Byte *)0x1 < response.responseHeader.additionalHeader.content.encoded.body.data)) {
        local_164 = *(UA_StatusCode *)response.resultsSize;
      }
      UA_DeleteMonitoredItemsResponse_deleteMembers((UA_DeleteMonitoredItemsResponse *)local_160);
      if ((local_164 == 0) || (local_164 == 0x80420000)) {
        if (*(long *)request.monitoredItemIds != 0) {
          *(undefined8 *)(*(long *)request.monitoredItemIds + 8) =
               *(undefined8 *)(request.monitoredItemIds + 2);
        }
        **(undefined8 **)(request.monitoredItemIds + 2) = *(undefined8 *)request.monitoredItemIds;
        UA_NodeId_deleteMembers((UA_NodeId *)(request.monitoredItemIds + 6));
        free(request.monitoredItemIds);
        client_local._4_4_ = 0;
      }
      else {
        logger = (client->config).logger;
        pcVar1 = UA_StatusCode_name(local_164);
        UA_LOG_INFO(logger,UA_LOGCATEGORY_CLIENT,
                    "Could not remove monitoreditem %u with error code %s",(ulong)monitoredItemId,
                    pcVar1);
        client_local._4_4_ = local_164;
      }
    }
  }
  return client_local._4_4_;
}

Assistant:

UA_StatusCode
UA_Client_Subscriptions_removeMonitoredItem(UA_Client *client, UA_UInt32 subscriptionId,
                                            UA_UInt32 monitoredItemId) {
    UA_Client_Subscription *sub;
    LIST_FOREACH(sub, &client->subscriptions, listEntry) {
        if(sub->subscriptionID == subscriptionId)
            break;
    }
    if(!sub)
        return UA_STATUSCODE_BADSUBSCRIPTIONIDINVALID;

    UA_Client_MonitoredItem *mon;
    LIST_FOREACH(mon, &sub->monitoredItems, listEntry) {
        if(mon->monitoredItemId == monitoredItemId)
            break;
    }
    if(!mon)
        return UA_STATUSCODE_BADMONITOREDITEMIDINVALID;

    /* remove the monitoreditem remotely */
    UA_DeleteMonitoredItemsRequest request;
    UA_DeleteMonitoredItemsRequest_init(&request);
    request.subscriptionId = sub->subscriptionID;
    request.monitoredItemIdsSize = 1;
    request.monitoredItemIds = &mon->monitoredItemId;
    UA_DeleteMonitoredItemsResponse response = UA_Client_Service_deleteMonitoredItems(client, request);

    UA_StatusCode retval = response.responseHeader.serviceResult;
    if(retval == UA_STATUSCODE_GOOD && response.resultsSize > 1)
        retval = response.results[0];
    UA_DeleteMonitoredItemsResponse_deleteMembers(&response);
    if(retval != UA_STATUSCODE_GOOD &&
       retval != UA_STATUSCODE_BADMONITOREDITEMIDINVALID) {
        UA_LOG_INFO(client->config.logger, UA_LOGCATEGORY_CLIENT,
                    "Could not remove monitoreditem %u with error code %s",
                    monitoredItemId, UA_StatusCode_name(retval));
        return retval;
    }

    LIST_REMOVE(mon, listEntry);
    UA_NodeId_deleteMembers(&mon->monitoredNodeId);
    UA_free(mon);
    return UA_STATUSCODE_GOOD;
}